

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O1

size_t adios2::utils::relative_to_absolute_step<std::complex<double>>
                 (Engine *fp,Variable<std::complex<double>_> *variable,size_t relstep)

{
  size_t *psVar1;
  _Rb_tree_node_base *p_Var2;
  size_t sVar3;
  
  psVar1 = (size_t *)(**(code **)(*(long *)fp + 0x58))();
  if (psVar1 == (size_t *)0x0) {
    p_Var2 = *(_Rb_tree_node_base **)(variable + 0x170);
    if (relstep != 0) {
      do {
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
        relstep = relstep - 1;
      } while (relstep != 0);
    }
    sVar3 = *(long *)(p_Var2 + 1) - 1;
  }
  else {
    sVar3 = *psVar1;
    if ((void *)psVar1[4] != (void *)0x0) {
      operator_delete((void *)psVar1[4]);
    }
    operator_delete(psVar1);
  }
  return sVar3;
}

Assistant:

size_t relative_to_absolute_step(core::Engine *fp, core::Variable<T> *variable,
                                 const size_t relstep)
{
    auto minBlocks = fp->MinBlocksInfo(*variable, relstep);

    if (minBlocks)
    {
        size_t Step = minBlocks->Step;
        delete minBlocks;
        return Step;
    }

    const std::map<size_t, std::vector<size_t>> &indices =
        variable->m_AvailableStepBlockIndexOffsets;
    auto itStep = indices.begin();
    size_t absstep = itStep->first - 1;

    for (size_t step = 0; step < relstep; step++)
    {
        ++itStep;
        absstep = itStep->first - 1;
    }
    return absstep;
}